

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_matrix.c
# Opt level: O0

void __thiscall Sparse_matrix_Append_element(void *this,uint row,uint col,double value)

{
  double value_local;
  uint col_local;
  uint row_local;
  Sparse_matrix *this_local;
  
  if (row == col) {
    *(double *)(*(long *)((long)this + 0x10) + (ulong)row * 8) = value;
  }
  else {
    *(int *)((long)this + 0x1c) = *(int *)((long)this + 0x1c) + 1;
    while (*(uint *)((long)this + 0x18) < row) {
      *(int *)((long)this + 0x18) = *(int *)((long)this + 0x18) + 1;
      *(undefined4 *)(*(long *)((long)this + 8) + (ulong)*(uint *)((long)this + 0x18) * 4) =
           *(undefined4 *)((long)this + 0x1c);
    }
    *(uint *)(*(long *)((long)this + 8) + (ulong)*(uint *)((long)this + 0x1c) * 4) = col;
    *(double *)(*(long *)((long)this + 0x10) + (ulong)*(uint *)((long)this + 0x1c) * 8) = value;
  }
  return;
}

Assistant:

void Sparse_matrix_Append_element (
    Sparse_matrix * this,
    unsigned row,
    unsigned col,
    double value) {

  if (row == col) {
    this->elements[row] = value;
    return;
  }

  ++(this->filled_element);
  while (this->current_row < row) {
    ++(this->current_row);
    this->indices[this->current_row] = this->filled_element;
  }
  this->indices[this->filled_element] = col;
  this->elements[this->filled_element] = value;
}